

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

bool __thiscall flatbuffers::GoGRPCGenerator::generate(GoGRPCGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Namespace *this_00;
  long lVar1;
  bool bVar2;
  long lVar3;
  Namespace *ns;
  Parameters *in_R8;
  long lVar4;
  FlatBufFile file;
  string filename;
  Parameters p;
  string output;
  undefined1 local_140 [16];
  undefined **local_130;
  Parser *local_128;
  string *local_120;
  undefined4 local_118;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [32];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_128 = this->parser_;
  local_120 = this->file_name_;
  local_130 = &PTR__CommentHolder_002fb398;
  local_118 = 0;
  local_b0._0_8_ = local_b0 + 0x10;
  local_b0._8_8_ = 0;
  local_b0[0x10] = '\0';
  local_90._M_p = (pointer)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_140._8_8_ = this;
  std::__cxx11::string::assign(local_b0);
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    lVar4 = (long)(int)((ulong)((long)(local_128->services_).vec.
                                      super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_128->services_).vec.
                                     super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (lVar4 <= lVar3) break;
    FlatBufFile::service((FlatBufFile *)local_140,(int)&local_130);
    __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (&((((SymbolTable<flatbuffers::Type> *)(local_140._8_8_ + 0x60))->dict)._M_t._M_impl.
                super__Rb_tree_header._M_header._M_right[0xb]._M_parent)->_M_color + lVar3 * 2);
    BaseGenerator::LastNamespacePart_abi_cxx11_
              (&local_50,(BaseGenerator *)__rhs[5]._M_string_length,ns);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = (Namespace *)__rhs[5]._M_string_length;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"",(allocator<char> *)&local_d0);
    Namespace::GetFullyQualifiedName(&local_50,this_00,&local_110,1000);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_110);
    grpc_go_generator::GenerateServiceSource_abi_cxx11_
              (&local_50,(grpc_go_generator *)&local_130,(File *)local_140._0_8_,(Service *)local_b0
               ,in_R8);
    BaseGenerator::NamespaceDir_abi_cxx11_
              (&local_f0,(BaseGenerator *)local_140._8_8_,(Namespace *)__rhs[5]._M_string_length,
               false);
    std::operator+(&local_d0,&local_f0,__rhs);
    std::operator+(&local_110,&local_d0,"_grpc.go");
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    bVar2 = SaveFile(local_110._M_dataplus._M_p,&local_50,false);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_50);
    if ((_func_int **)local_140._0_8_ != (_func_int **)0x0) {
      (*(*(_func_int ***)local_140._0_8_)[1])();
    }
    lVar1 = lVar3 + 1;
  } while (bVar2);
  grpc_go_generator::Parameters::~Parameters((Parameters *)local_b0);
  return lVar4 <= lVar3;
}

Assistant:

bool generate() {
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageGo);
    grpc_go_generator::Parameters p;
    p.custom_method_io_type = "flatbuffers.Builder";
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      const Definition *def = parser_.services_.vec[i];
      p.package_name = LastNamespacePart(*(def->defined_namespace));
      p.service_prefix =
          def->defined_namespace->GetFullyQualifiedName("");  // file.package();
      std::string output =
          grpc_go_generator::GenerateServiceSource(&file, service.get(), &p);
      std::string filename =
          NamespaceDir(*def->defined_namespace) + def->name + "_grpc.go";
      if (!flatbuffers::SaveFile(filename.c_str(), output, false)) return false;
    }
    return true;
  }